

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall
kws::Parser::IsBetweenChars
          (Parser *this,char begin,char end,size_t pos,bool withComments,string *buffer)

{
  size_t pos_00;
  size_t sVar1;
  bool bVar2;
  string *this_00;
  string stream;
  string local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string(local_90,(string *)buffer);
  if (buffer->_M_string_length == 0) {
    std::__cxx11::string::_M_assign(local_90);
    if (withComments) {
      std::__cxx11::string::_M_assign(local_90);
    }
  }
  if (pos == 0xffffffffffffffff) {
    bVar2 = false;
  }
  else {
    pos_00 = std::__cxx11::string::find((char)local_90,(ulong)(uint)(int)begin);
    std::__cxx11::string::string((string *)&local_70,(string *)buffer);
    sVar1 = FindClosingChar(this,begin,end,pos_00,!withComments,&local_70);
    this_00 = &local_70;
    while( true ) {
      std::__cxx11::string::~string((string *)this_00);
      bVar2 = pos_00 < sVar1 && sVar1 != 0xffffffffffffffff;
      if ((pos_00 >= sVar1 || sVar1 == 0xffffffffffffffff) || (pos_00 < pos && pos < sVar1)) break;
      pos_00 = std::__cxx11::string::find((char)local_90,(ulong)(uint)(int)begin);
      std::__cxx11::string::string((string *)&local_50,(string *)buffer);
      sVar1 = FindClosingChar(this,begin,end,pos_00,!withComments,&local_50);
      this_00 = &local_50;
    }
  }
  std::__cxx11::string::~string(local_90);
  return bVar2;
}

Assistant:

bool Parser::IsBetweenChars(const char begin, const char end ,size_t pos,
                            bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  size_t b0 = stream.find(begin,0);
  size_t b1 = this->FindClosingChar(begin,end,b0,!withComments,buffer);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(begin,b0+1);
    b1 = this->FindClosingChar(begin,end,b0,!withComments,buffer);
    }
  return false;
}